

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColecoVision.cpp
# Opt level: O0

void __thiscall Coleco::Vision::Joystick::Joystick(Joystick *this)

{
  initializer_list<Inputs::Joystick::Input> __l;
  allocator<Inputs::Joystick::Input> local_159;
  Input local_158;
  Input local_148;
  Input local_138;
  Input local_128;
  Input local_118;
  Input local_108;
  Input local_f8;
  Input local_e8;
  Input local_d8;
  Input local_c8;
  Input local_b8;
  Input local_a8;
  Input local_98;
  Input local_88;
  Input local_78;
  Input local_68;
  Input local_58;
  Input local_48;
  Input *local_38;
  size_type local_30;
  vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_> local_28;
  Joystick *local_10;
  Joystick *this_local;
  
  local_10 = this;
  Inputs::Joystick::Input::Input(&local_158,Up,0);
  Inputs::Joystick::Input::Input(&local_148,Down,0);
  Inputs::Joystick::Input::Input(&local_138,Left,0);
  Inputs::Joystick::Input::Input(&local_128,Right,0);
  Inputs::Joystick::Input::Input(&local_118,Fire,0);
  Inputs::Joystick::Input::Input(&local_108,Fire,1);
  Inputs::Joystick::Input::Input(&local_f8,L'0');
  Inputs::Joystick::Input::Input(&local_e8,L'1');
  Inputs::Joystick::Input::Input(&local_d8,L'2');
  Inputs::Joystick::Input::Input(&local_c8,L'3');
  Inputs::Joystick::Input::Input(&local_b8,L'4');
  Inputs::Joystick::Input::Input(&local_a8,L'5');
  Inputs::Joystick::Input::Input(&local_98,L'6');
  Inputs::Joystick::Input::Input(&local_88,L'7');
  Inputs::Joystick::Input::Input(&local_78,L'8');
  Inputs::Joystick::Input::Input(&local_68,L'9');
  Inputs::Joystick::Input::Input(&local_58,L'*');
  Inputs::Joystick::Input::Input(&local_48,L'#');
  local_30 = 0x12;
  local_38 = &local_158;
  std::allocator<Inputs::Joystick::Input>::allocator(&local_159);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::vector
            (&local_28,__l,&local_159);
  Inputs::ConcreteJoystick::ConcreteJoystick(&this->super_ConcreteJoystick,&local_28);
  std::vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::~vector(&local_28)
  ;
  std::allocator<Inputs::Joystick::Input>::~allocator(&local_159);
  (this->super_ConcreteJoystick).super_Joystick._vptr_Joystick =
       (_func_int **)&PTR__Joystick_00c9e4d8;
  this->direction_ = 0xff;
  this->keypad_ = '\x7f';
  return;
}

Assistant:

Joystick() :
			ConcreteJoystick({
				Input(Input::Up),
				Input(Input::Down),
				Input(Input::Left),
				Input(Input::Right),

				Input(Input::Fire, 0),
				Input(Input::Fire, 1),

				Input('0'),	Input('1'),	Input('2'),
				Input('3'),	Input('4'),	Input('5'),
				Input('6'),	Input('7'),	Input('8'),
				Input('9'),	Input('*'),	Input('#'),
			}) {}